

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O1

bool __thiscall Js::AsmJsFunctionInfo::Init(AsmJsFunctionInfo *this,AsmJsFunc *func)

{
  ushort uVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  AsmJsVarType type;
  BOOL BVar5;
  ScriptContext *pSVar6;
  Recycler *pRVar7;
  undefined4 *puVar8;
  Which *pWVar9;
  uint *puVar10;
  BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar11;
  AsmJsType *pAVar12;
  uint uVar13;
  ArgSlot index;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  WAsmJs::TypedRegisterAllocator::CommitToFunctionInfo
            (&func->mTypedRegisterAllocator,this,func->mFuncBody);
  pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)func->mFuncBody);
  data._32_8_ = pSVar6->recycler;
  uVar1 = (func->super_AsmJsFunctionDeclaration).mArgCount;
  data.plusSize = (size_t)uVar1;
  this->mArgCount = uVar1;
  if (data.plusSize != 0) {
    local_60 = (undefined1  [8])&AsmJsVarType::Which::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_4741059;
    data.filename._0_4_ = 0x338;
    pRVar7 = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_60);
    uVar1 = this->mArgCount;
    if ((ulong)uVar1 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar7,(TrackAllocData *)0x0);
      pWVar9 = &DAT_00000008;
    }
    else {
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00967274;
        *puVar8 = 0;
      }
      pWVar9 = (Which *)Memory::Recycler::
                        AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                                  (pRVar7,(ulong)uVar1);
      if (pWVar9 == (Which *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_00967274;
        *puVar8 = 0;
      }
    }
    Memory::Recycler::WBSetBit((char *)&this->mArgType);
    (this->mArgType).ptr = pWVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->mArgType);
  }
  uVar13 = 3;
  if (3 < (ushort)*(uint *)&this->mArgCount) {
    uVar13 = *(uint *)&this->mArgCount;
  }
  this->mArgSizesLength = (Type)uVar13;
  data.plusSize = (size_t)(uVar13 & 0xffff);
  local_60 = (undefined1  [8])&unsigned_int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_4741059;
  data.filename._0_4_ = 0x33e;
  pRVar7 = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_60);
  uVar1 = this->mArgSizesLength;
  if (uVar1 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar7,(TrackAllocData *)0x0);
    puVar10 = (uint *)&DAT_00000008;
  }
  else {
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00967274;
      *puVar8 = 0;
    }
    puVar10 = (uint *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                (pRVar7,(ulong)uVar1 << 2);
    if (puVar10 == (uint *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_00967274:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
  }
  Memory::Recycler::WBSetBit((char *)&this->mArgSizes);
  (this->mArgSizes).ptr = puVar10;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->mArgSizes);
  uVar3 = data._32_8_;
  (this->mReturnType).which_ =
       *(Type *)&(func->super_AsmJsFunctionDeclaration).super_AsmJsSymbol.field_0x14;
  local_60 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<int,long,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_4741059;
  data.filename._0_4_ = 0x341;
  pRVar7 = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_60);
  pBVar11 = (BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar7,0x38bbb2);
  (pBVar11->buckets).ptr = (int *)0x0;
  (pBVar11->entries).ptr = (SimpleDictionaryEntry<int,_long> *)0x0;
  pBVar11->alloc = (Type)uVar3;
  pBVar11->size = 0;
  pBVar11->bucketCount = 0;
  pBVar11->count = 0;
  pBVar11->freeCount = 0;
  pBVar11->modFunctionIndex = 0x4b;
  pBVar11->stats = (Type)0x0;
  Memory::Recycler::WBSetBit((char *)&this->mbyteCodeTJMap);
  (this->mbyteCodeTJMap).ptr = pBVar11;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->mbyteCodeTJMap);
  if (this->mArgCount != 0) {
    index = 0;
    do {
      pAVar12 = AsmJsFunctionDeclaration::GetArgType(&func->super_AsmJsFunctionDeclaration,index);
      type = AsmJsVarType::FromCheckedType((AsmJsType)pAVar12->which_);
      SetArgType(this,type,index);
      index = index + 1;
    } while (index < this->mArgCount);
  }
  return true;
}

Assistant:

bool AsmJsFunctionInfo::Init(AsmJsFunc* func)
    {
        func->CommitToFunctionInfo(this, func->GetFuncBody());

        Recycler* recycler = func->GetFuncBody()->GetScriptContext()->GetRecycler();
        mArgCount = func->GetArgCount();
        if (mArgCount > 0)
        {
            mArgType = RecyclerNewArrayLeaf(recycler, AsmJsVarType::Which, mArgCount);
        }

        // on x64, AsmJsExternalEntryPoint reads first 3 elements to figure out how to shadow args on stack
        // always alloc space for these such that we need to do less work in the entrypoint
        mArgSizesLength = max(mArgCount, 3ui16);
        mArgSizes = RecyclerNewArrayLeafZ(recycler, uint, mArgSizesLength);

        mReturnType = func->GetReturnType();
        mbyteCodeTJMap = RecyclerNew(recycler, ByteCodeToTJMap,recycler);

        for(ArgSlot i = 0; i < GetArgCount(); i++)
        {
            AsmJsType varType = func->GetArgType(i);
            SetArgType(AsmJsVarType::FromCheckedType(varType), i);
        }

        return true;
    }